

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O2

bool adiak::internal::parse<adiak::catstring>::make_value
               (catstring *obj,adiak_value_t *val,adiak_datatype_t *param_3)

{
  char *pcVar1;
  char *local_30 [4];
  
  std::__cxx11::string::string((string *)local_30,(string *)obj);
  pcVar1 = strdup(local_30[0]);
  val->v_ptr = pcVar1;
  std::__cxx11::string::~string((string *)local_30);
  return true;
}

Assistant:

static bool make_value(T &obj, adiak_value_t *val, adiak_datatype_t *) {
            element_type<T>::set(*val, obj);
            return true;
         }